

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

void __thiscall
google::protobuf::EnumValueOptions::EnumValueOptions(EnumValueOptions *this,EnumValueOptions *from)

{
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__EnumValueOptions_001fa270;
  internal::ExtensionSet::ExtensionSet(&this->_extensions_);
  UnknownFieldSet::UnknownFieldSet(&this->_unknown_fields_);
  (this->uninterpreted_option_).super_RepeatedPtrFieldBase.elements_ = (void **)0x0;
  (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->uninterpreted_option_).super_RepeatedPtrFieldBase.allocated_size_ = 0;
  (this->uninterpreted_option_).super_RepeatedPtrFieldBase.total_size_ = 0;
  this->_cached_size_ = 0;
  this->_has_bits_[0] = 0;
  MergeFrom(this,from);
  return;
}

Assistant:

EnumValueOptions::EnumValueOptions(const EnumValueOptions& from)
  : ::google::protobuf::Message() {
  SharedCtor();
  MergeFrom(from);
}